

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O1

int read_header(archive_read *a,archive_entry *entry)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  mode_t mVar6;
  uint uVar7;
  int *piVar8;
  int64_t iVar9;
  char *pcVar10;
  archive_entry_linkresolver *res;
  void *__s;
  void *pvVar11;
  archive_string *paVar12;
  ulong uVar13;
  mtree_entry *pmVar14;
  mtree_entry *pmVar15;
  size_t sVar16;
  byte *pbVar17;
  long lVar18;
  size_t sVar19;
  char *pcVar20;
  size_t sVar21;
  long lVar22;
  byte *pbVar23;
  char *pcVar24;
  byte *pbVar25;
  ulong uVar26;
  mtree *pmVar27;
  stat *__buf;
  undefined1 *puVar28;
  timespec *ptVar29;
  mtree *pmVar30;
  mtree_option *global;
  archive_entry *sparse_entry;
  stat st_storage;
  archive_entry *local_120;
  archive_read *local_118;
  uint local_10c;
  mtree_entry *local_108;
  mtree *local_100;
  mtree_entry *local_f8;
  byte *local_f0;
  byte *local_e8;
  long local_e0;
  archive_entry *local_d8;
  mtree_entry *local_d0;
  archive_entry *local_c8;
  stat local_c0;
  
  pmVar30 = (mtree *)a->format->data;
  local_118 = a;
  local_c8 = entry;
  if (-1 < pmVar30->fd) {
    close(pmVar30->fd);
    pmVar30->fd = -1;
  }
  local_100 = pmVar30;
  if (pmVar30->entries == (mtree_entry *)0x0) {
    res = archive_entry_linkresolver_new();
    pmVar30->resolver = res;
    if (res == (archive_entry_linkresolver *)0x0) {
      return -0x1e;
    }
    local_d0 = (mtree_entry *)&pmVar30->entries;
    archive_entry_linkresolver_set_strategy(res,0x80000);
    pmVar30->archive_format = 0x80000;
    pmVar30->archive_format_name = "mtree";
    local_120 = (archive_entry *)0x0;
    detect_form(local_118,(int *)&local_d8);
    local_e0 = 1;
    local_108 = (mtree_entry *)0x0;
LAB_004f1645:
    __s = __archive_read_ahead(local_118,1,(ssize_t *)&local_c0);
    if (__s != (void *)0x0) {
      uVar26 = 0;
      lVar22 = 0;
LAB_004f166a:
      if (-1 < (long)local_c0.st_dev) {
        pvVar11 = memchr(__s,10,local_c0.st_dev);
        pmVar27 = local_100;
        if (pvVar11 != (void *)0x0) {
          local_c0.st_dev = (long)pvVar11 + (1 - (long)__s);
        }
        if ((long)(local_c0.st_dev + uVar26) < 0x10000) {
          paVar12 = archive_string_ensure(&local_100->line,local_c0.st_dev + uVar26 + 1);
          if (paVar12 != (archive_string *)0x0) {
            memcpy((pmVar27->line).s + uVar26,__s,local_c0.st_dev);
            __archive_read_consume(local_118,local_c0.st_dev);
            uVar26 = uVar26 + local_c0.st_dev;
            (pmVar27->line).s[uVar26] = '\0';
            pmVar27 = (mtree *)(pmVar27->line).s;
            pbVar25 = (byte *)((long)&(pmVar27->line).s + lVar22);
            do {
              bVar1 = *pbVar25;
              pbVar17 = pbVar25;
              if (bVar1 < 0x5c) {
                if (bVar1 == 0) goto LAB_004f1769;
                if (bVar1 == 10) goto LAB_004f17ce;
                if (bVar1 == 0x23) {
                  if (pvVar11 == (void *)0x0) goto LAB_004f1769;
                  goto LAB_004f17ce;
                }
              }
              else if (bVar1 == 0x5c) {
                pbVar23 = pbVar25 + 1;
                bVar1 = pbVar25[1];
                pbVar17 = pbVar23;
                if (bVar1 != 0x5c) {
                  if (bVar1 == 0) goto LAB_004f1769;
                  pbVar17 = pbVar25;
                  if (bVar1 == 10) goto LAB_004f174c;
                }
              }
              pbVar25 = pbVar17 + 1;
            } while( true );
          }
          iVar4 = 0xc;
          pcVar10 = "Can\'t allocate working buffer";
        }
        else {
          iVar4 = 0x54;
          pcVar10 = "Line too long";
        }
        archive_set_error(&local_118->archive,iVar4,pcVar10);
      }
      uVar26 = 0xffffffffffffffe2;
      pmVar27 = pmVar30;
      goto LAB_004f17ce;
    }
LAB_004f1791:
    uVar26 = 0;
    pmVar27 = pmVar30;
LAB_004f17ce:
    iVar4 = (int)local_d8;
    pmVar30 = local_100;
    if (uVar26 == 0) {
      local_100->this_entry = local_100->entries;
      free_options((mtree_option *)local_120);
      iVar4 = 0;
      goto LAB_004f1cb5;
    }
    if (-1 < (long)uVar26) {
      for (lVar22 = 0; uVar13 = (ulong)*(byte *)((long)&(pmVar27->line).s + lVar22), uVar13 < 0x30;
          lVar22 = lVar22 + 1) {
        if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
          if ((0x800002401U >> (uVar13 & 0x3f) & 1) != 0) goto LAB_004f1c6f;
          if (uVar13 == 0x2f) {
            pcVar10 = (char *)((long)&(pmVar27->line).s + lVar22);
            iVar4 = strncmp(pcVar10,"/set",4);
            if (iVar4 == 0) {
              cVar2 = *(char *)((long)&(pmVar27->line).s + lVar22 + 4);
              if ((cVar2 == ' ') || (cVar2 == '\t')) {
                pcVar10 = (char *)((long)&(pmVar27->line).s + lVar22 + 4);
                goto LAB_004f1967;
              }
            }
            else {
              iVar4 = strncmp(pcVar10,"/unset",6);
              if ((iVar4 == 0) &&
                 ((cVar2 = *(char *)((long)&(pmVar27->line).s + lVar22 + 6), cVar2 == ' ' ||
                  (cVar2 == '\t')))) {
                pcVar20 = (char *)((long)&(pmVar27->line).s + lVar22 + 6);
                pcVar10 = strchr(pcVar20,0x3d);
                if (pcVar10 != (char *)0x0) {
                  iVar4 = -1;
                  pcVar10 = "/unset shall not contain `=\'";
                  goto LAB_004f19f7;
                }
                sVar16 = strspn(pcVar20," \t\r\n");
                uVar26 = 0;
                if (*(char *)((long)&(pmVar27->line).s + lVar22 + 6 + sVar16) != '\0') {
                  pcVar10 = (char *)((long)&(pmVar27->line).s + lVar22 + sVar16 + 6);
                  do {
                    sVar16 = strcspn(pcVar10," \t\r\n");
                    if ((sVar16 == 3) && (iVar4 = strncmp(pcVar10,"all",3), iVar4 == 0)) {
                      free_options((mtree_option *)local_120);
                      local_120 = (archive_entry *)0x0;
                    }
                    else {
                      remove_option((mtree_option **)&local_120,pcVar10,sVar16);
                    }
                    pcVar20 = pcVar10 + sVar16;
                    sVar16 = strspn(pcVar20," \t\r\n");
                    pcVar10 = pcVar20 + sVar16;
                  } while (pcVar20[sVar16] != '\0');
                }
                goto LAB_004f1c6a;
              }
            }
            archive_set_error(&local_118->archive,0x54,"Can\'t parse line %ju",local_e0);
            free_options((mtree_option *)local_120);
            iVar4 = -0x1e;
            pmVar30 = local_100;
            goto LAB_004f1cb5;
          }
          break;
        }
      }
      pmVar14 = (mtree_entry *)malloc(0x20);
      if (pmVar14 != (mtree_entry *)0x0) {
        pbVar25 = (byte *)((long)&(pmVar27->line).s + lVar22);
        sVar16 = uVar26 - lVar22;
        *(undefined8 *)((long)&pmVar14->options + 2) = 0;
        *(undefined8 *)((long)&pmVar14->name + 2) = 0;
        pmVar14->next = (mtree_entry *)0x0;
        pmVar14->options = (mtree_option *)0x0;
        pmVar15 = local_108;
        if (local_108 == (mtree_entry *)0x0) {
          pmVar15 = local_d0;
        }
        pmVar15->next = pmVar14;
        local_f8 = pmVar14;
        if (iVar4 == 0) {
          sVar19 = strcspn((char *)pbVar25," \t\r\n");
          local_f0 = pbVar25 + sVar19 + sVar16;
          pbVar17 = pbVar25;
          pbVar25 = pbVar25 + sVar19;
          sVar16 = sVar19;
        }
        else {
          pbVar23 = pbVar25 + (sVar16 - 1);
          if (0 < (long)sVar16) {
            do {
              if ((0x20 < (ulong)*pbVar23) || ((0x100002600U >> ((ulong)*pbVar23 & 0x3f) & 1) == 0))
              goto LAB_004f1ad6;
              pbVar23 = pbVar23 + -1;
              bVar3 = 1 < (long)sVar16;
              sVar16 = sVar16 - 1;
            } while (bVar3);
            sVar16 = 0;
            pbVar23 = (byte *)((long)pmVar27 + lVar22 + -1);
          }
LAB_004f1ad6:
          if ((long)sVar16 < 1) {
            pbVar17 = pbVar23;
            sVar16 = 0;
            local_f0 = pbVar23;
          }
          else {
            pbVar17 = pbVar23 + -sVar16;
            lVar18 = 0;
            do {
              if (((ulong)pbVar23[lVar18] < 0x21) &&
                 ((0x100002600U >> ((ulong)pbVar23[lVar18] & 0x3f) & 1) != 0)) {
                pbVar17 = pbVar23 + lVar18 + 1;
                sVar16 = -lVar18;
                local_f0 = pbVar23 + lVar18 + 1;
                break;
              }
              lVar18 = lVar18 + -1;
              local_f0 = pbVar17;
            } while (sVar16 + lVar18 != 0);
          }
        }
        pbVar23 = (byte *)malloc(sVar16 + 1);
        pmVar14 = local_f8;
        local_f8->name = (char *)pbVar23;
        if (pbVar23 == (byte *)0x0) {
          piVar8 = __errno_location();
          archive_set_error(&local_118->archive,*piVar8,"Can\'t allocate memory");
          uVar26 = 0xffffffe2;
          local_108 = pmVar14;
          goto LAB_004f1c6a;
        }
        local_108 = (mtree_entry *)&local_f8->options;
        local_e8 = pbVar23;
        memcpy(pbVar23,pbVar17,sVar16);
        local_e8[sVar16] = 0;
        parse_escapes((char *)local_e8,pmVar14);
        puVar28 = (undefined1 *)&local_120;
        do {
          puVar28 = *(undefined1 **)puVar28;
          if (puVar28 == (undefined1 *)0x0) goto LAB_004f1bd6;
          pcVar10 = *(char **)((long)puVar28 + 8);
          sVar16 = strlen(pcVar10);
          uVar7 = add_option(local_118,(mtree_option **)local_108,pcVar10,sVar16);
        } while (uVar7 == 0);
        goto LAB_004f1c5d;
      }
      piVar8 = __errno_location();
      iVar4 = *piVar8;
      pcVar10 = "Can\'t allocate memory";
LAB_004f19f7:
      archive_set_error(&local_118->archive,iVar4,pcVar10);
      uVar26 = 0xffffffe2;
      goto LAB_004f1c6a;
    }
LAB_004f1c8a:
    iVar4 = (int)uVar26;
    free_options((mtree_option *)local_120);
    pmVar30 = local_100;
LAB_004f1cb5:
    if (iVar4 != 0) {
      return iVar4;
    }
  }
  (local_118->archive).archive_format = pmVar30->archive_format;
  (local_118->archive).archive_format_name = pmVar30->archive_format_name;
  pmVar14 = pmVar30->this_entry;
  if (pmVar14 != (mtree_entry *)0x0) {
    local_108 = (mtree_entry *)&pmVar30->current_dir;
    do {
      iVar4 = strcmp(pmVar14->name,"..");
      if (iVar4 == 0) {
        pmVar14->used = '\x01';
        sVar21 = (pmVar30->current_dir).length;
        if (sVar21 != 0) {
          pcVar10 = (pmVar30->current_dir).s;
          pcVar20 = pcVar10 + sVar21;
          do {
            pcVar24 = pcVar20;
            pcVar20 = pcVar24 + -1;
            if (pcVar20 < pcVar10) break;
          } while (*pcVar20 != '/');
          pcVar24 = pcVar24 + -2;
          if (pcVar20 < pcVar10) {
            pcVar24 = pcVar20;
          }
          (pmVar30->current_dir).length = (size_t)(pcVar24 + (1 - (long)pcVar10));
        }
      }
      if (pmVar14->used == '\0') {
        local_120 = local_c8;
        pmVar14->used = '\x01';
        archive_entry_set_filetype(local_c8,0x8000);
        archive_entry_set_size(local_120,0);
        (pmVar30->contents_name).length = 0;
        local_10c = 0;
        iVar4 = parse_line(local_118,local_120,pmVar30,pmVar14,(int *)&local_10c);
        pmVar15 = local_108;
        if (pmVar14->full == '\0') {
          sVar21 = (pmVar30->current_dir).length;
          if (sVar21 != 0) {
            archive_strcat((archive_string *)local_108,"/");
          }
          archive_strcat((archive_string *)pmVar15,pmVar14->name);
          archive_entry_copy_pathname(local_120,(char *)pmVar15->next);
          mVar6 = archive_entry_filetype(local_120);
          if (mVar6 != 0x4000) {
            (pmVar30->current_dir).length = sVar21;
          }
        }
        else {
          archive_entry_copy_pathname(local_120,pmVar14->name);
          for (pmVar15 = pmVar14->next; pmVar15 != (mtree_entry *)0x0; pmVar15 = pmVar15->next) {
            if (((pmVar15->full != '\0') && (pmVar15->used == '\0')) &&
               (iVar5 = strcmp(pmVar14->name,pmVar15->name), iVar5 == 0)) {
              pmVar15->used = '\x01';
              iVar5 = parse_line(local_118,local_120,pmVar30,pmVar15,(int *)&local_10c);
              if (iVar5 < iVar4) {
                iVar4 = iVar5;
              }
            }
          }
        }
        if (pmVar30->checkfs == '\0') {
LAB_004f1529:
          iVar9 = archive_entry_size(local_120);
          pmVar30->cur_size = iVar9;
          pmVar30->offset = 0;
          bVar3 = true;
          iVar5 = iVar4;
        }
        else {
          pmVar30->fd = -1;
          if ((pmVar30->contents_name).length == 0) {
            pcVar10 = archive_entry_pathname(local_120);
          }
          else {
            pcVar10 = (pmVar30->contents_name).s;
          }
          mVar6 = archive_entry_filetype(local_120);
          if ((mVar6 == 0x8000) || (mVar6 = archive_entry_filetype(local_120), mVar6 == 0x4000)) {
            iVar5 = open(pcVar10,0x80000);
            pmVar30->fd = iVar5;
            __archive_ensure_cloexec_flag(iVar5);
            if (pmVar30->fd == -1) {
              piVar8 = __errno_location();
              if ((*piVar8 != 2) || ((pmVar30->contents_name).length != 0)) {
                archive_set_error(&local_118->archive,*piVar8,"Can\'t open %s",pcVar10);
                iVar4 = -0x14;
              }
            }
          }
          if (pmVar30->fd < 0) {
            __buf = &local_c0;
            iVar5 = lstat(pcVar10,__buf);
            if (iVar5 == -1) goto LAB_004f12de;
            ptVar29 = &local_c0.st_mtim;
          }
          else {
            __buf = &local_c0;
            iVar5 = fstat(pmVar30->fd,__buf);
            ptVar29 = &local_c0.st_mtim;
            if (iVar5 == -1) {
              piVar8 = __errno_location();
              archive_set_error(&local_118->archive,*piVar8,"Could not fstat %s",pcVar10);
              pmVar30 = local_100;
              close(local_100->fd);
              pmVar30->fd = -1;
              iVar4 = -0x14;
LAB_004f12de:
              ptVar29 = (timespec *)0x58;
              __buf = (stat *)0x0;
            }
          }
          if (__buf == (stat *)0x0) {
            bVar3 = false;
            pmVar30 = local_100;
            iVar5 = 0;
            if ((local_10c & 0x800) == 0) goto LAB_004f1529;
          }
          else {
            if (((((((__buf->st_mode & 0xf000) == 0x8000) &&
                   (mVar6 = archive_entry_filetype(local_120), mVar6 == 0x8000)) ||
                  (((__buf->st_mode & 0xf000) == 0xa000 &&
                   (mVar6 = archive_entry_filetype(local_120), mVar6 == 0xa000)))) ||
                 (((~__buf->st_mode & 0xc000) == 0 &&
                  (mVar6 = archive_entry_filetype(local_120), mVar6 == 0xc000)))) ||
                (((__buf->st_mode & 0xf000) == 0x2000 &&
                 (mVar6 = archive_entry_filetype(local_120), mVar6 == 0x2000)))) ||
               (((((__buf->st_mode & 0xf000) == 0x6000 &&
                  (mVar6 = archive_entry_filetype(local_120), mVar6 == 0x6000)) ||
                 (((__buf->st_mode & 0xf000) == 0x4000 &&
                  (mVar6 = archive_entry_filetype(local_120), mVar6 == 0x4000)))) ||
                (((__buf->st_mode & 0xf000) == 0x1000 &&
                 (mVar6 = archive_entry_filetype(local_120), mVar6 == 0x1000)))))) {
              uVar7 = local_10c;
              if (((local_10c & 0x1001) != 1) &&
                 ((mVar6 = archive_entry_filetype(local_120), mVar6 == 0x2000 ||
                  (mVar6 = archive_entry_filetype(local_120), mVar6 == 0x6000)))) {
                archive_entry_set_rdev(local_120,__buf->st_rdev);
              }
              if ((uVar7 & 0xc) == 0 || (uVar7 >> 0xc & 1) != 0) {
                archive_entry_set_gid(local_120,(ulong)__buf->st_gid);
              }
              if ((uVar7 & 0x600) == 0 || (uVar7 >> 0xc & 1) != 0) {
                archive_entry_set_uid(local_120,(ulong)__buf->st_uid);
              }
              if ((uVar7 & 0x1010) != 0x10) {
                archive_entry_set_mtime(local_120,(__buf->st_mtim).tv_sec,ptVar29->tv_nsec);
              }
              if ((uVar7 & 0x1020) != 0x20) {
                archive_entry_set_nlink(local_120,(uint)__buf->st_nlink);
              }
              pmVar30 = local_100;
              if ((uVar7 & 0x1040) != 0x40) {
                archive_entry_set_perm(local_120,__buf->st_mode);
              }
              if ((uVar7 & 0x1080) != 0x80) {
                archive_entry_set_size(local_120,__buf->st_size);
              }
              archive_entry_set_ino(local_120,__buf->st_ino);
              archive_entry_set_dev(local_120,__buf->st_dev);
              archive_entry_linkify(pmVar30->resolver,&local_120,&local_d8);
              goto LAB_004f1529;
            }
            pmVar30 = local_100;
            if (-1 < local_100->fd) {
              close(local_100->fd);
            }
            pmVar30->fd = -1;
            iVar5 = iVar4;
            if ((local_10c & 0x800) == 0) {
              bVar3 = true;
              if (iVar4 == 0) {
                pcVar10 = archive_entry_pathname(local_120);
                archive_set_error(&local_118->archive,-1,
                                  "mtree specification has different type for %s",pcVar10);
                iVar5 = -0x14;
                bVar3 = true;
              }
            }
            else {
              bVar3 = false;
            }
          }
        }
        if (bVar3) {
          return iVar5;
        }
      }
      pmVar14 = pmVar30->this_entry->next;
      pmVar30->this_entry = pmVar14;
    } while (pmVar14 != (mtree_entry *)0x0);
  }
  return 1;
LAB_004f174c:
  memmove(pbVar25,pbVar23,(size_t)((long)pmVar27 + (uVar26 - (long)pbVar25) + 1));
  uVar26 = uVar26 - 1;
  pbVar25 = pbVar23;
LAB_004f1769:
  lVar22 = (long)pbVar25 - (long)(local_100->line).s;
  __s = __archive_read_ahead(local_118,1,(ssize_t *)&local_c0);
  if (__s == (void *)0x0) goto LAB_004f1791;
  goto LAB_004f166a;
  while( true ) {
    pcVar24 = pcVar10 + sVar16;
    sVar16 = strcspn(pcVar24," \t\r\n");
    pcVar10 = pcVar24 + sVar16;
    pcVar20 = strchr(pcVar24,0x3d);
    sVar21 = (long)pcVar20 - (long)pcVar24;
    if (pcVar10 < pcVar20) {
      sVar21 = sVar16;
    }
    remove_option((mtree_option **)&local_120,pcVar24,sVar21);
    uVar7 = add_option(local_118,(mtree_option **)&local_120,pcVar24,sVar16);
    if (uVar7 != 0) break;
LAB_004f1967:
    sVar16 = strspn(pcVar10," \t\r\n");
    if (pcVar10[sVar16] == '\0') {
      uVar26 = 0;
      goto LAB_004f1c6a;
    }
  }
  uVar26 = (ulong)uVar7;
  goto LAB_004f1c6a;
  while( true ) {
    sVar19 = strcspn((char *)pbVar25," \t\r\n");
    local_e8 = pbVar25 + sVar19;
    pbVar17 = (byte *)strchr((char *)pbVar25,0x3d);
    pmVar14 = local_108;
    sVar16 = (long)pbVar17 - (long)pbVar25;
    if (pbVar25 + sVar19 < pbVar17) {
      sVar16 = sVar19;
    }
    if (pbVar17 == (byte *)0x0) {
      sVar16 = sVar19;
    }
    remove_option((mtree_option **)local_108,(char *)pbVar25,sVar16);
    uVar7 = add_option(local_118,(mtree_option **)pmVar14,(char *)pbVar25,sVar19);
    pbVar25 = local_e8;
    if (uVar7 != 0) break;
LAB_004f1bd6:
    sVar16 = strspn((char *)pbVar25," \t\r\n");
    uVar26 = 0;
    if ((pbVar25[sVar16] == 0) || (pbVar25 = pbVar25 + sVar16, local_f0 <= pbVar25))
    goto LAB_004f1c60;
  }
LAB_004f1c5d:
  uVar26 = (ulong)uVar7;
LAB_004f1c60:
  local_108 = local_f8;
LAB_004f1c6a:
  if ((int)uVar26 != 0) goto LAB_004f1c8a;
LAB_004f1c6f:
  local_e0 = local_e0 + 1;
  pmVar30 = (mtree *)((long)&(pmVar27->line).s + lVar22);
  goto LAB_004f1645;
}

Assistant:

static int
read_header(struct archive_read *a, struct archive_entry *entry)
{
	struct mtree *mtree;
	char *p;
	int r, use_next;

	mtree = (struct mtree *)(a->format->data);

	if (mtree->fd >= 0) {
		close(mtree->fd);
		mtree->fd = -1;
	}

	if (mtree->entries == NULL) {
		mtree->resolver = archive_entry_linkresolver_new();
		if (mtree->resolver == NULL)
			return ARCHIVE_FATAL;
		archive_entry_linkresolver_set_strategy(mtree->resolver,
		    ARCHIVE_FORMAT_MTREE);
		r = read_mtree(a, mtree);
		if (r != ARCHIVE_OK)
			return (r);
	}

	a->archive.archive_format = mtree->archive_format;
	a->archive.archive_format_name = mtree->archive_format_name;

	for (;;) {
		if (mtree->this_entry == NULL)
			return (ARCHIVE_EOF);
		if (strcmp(mtree->this_entry->name, "..") == 0) {
			mtree->this_entry->used = 1;
			if (archive_strlen(&mtree->current_dir) > 0) {
				/* Roll back current path. */
				p = mtree->current_dir.s
				    + mtree->current_dir.length - 1;
				while (p >= mtree->current_dir.s && *p != '/')
					--p;
				if (p >= mtree->current_dir.s)
					--p;
				mtree->current_dir.length
				    = p - mtree->current_dir.s + 1;
			}
		}
		if (!mtree->this_entry->used) {
			use_next = 0;
			r = parse_file(a, entry, mtree, mtree->this_entry, &use_next);
			if (use_next == 0)
				return (r);
		}
		mtree->this_entry = mtree->this_entry->next;
	}
}